

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

int glfwGetGamepadState(int jid,GLFWgamepadstate *state)

{
  uint8_t uVar1;
  byte bVar2;
  _GLFWmapping *p_Var3;
  int iVar4;
  long lVar5;
  uchar uVar6;
  int iVar7;
  float fVar8;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48d,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (0xf < (uint)jid) {
    __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48e,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  if (state == (GLFWgamepadstate *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dilevin[P]computer-graphics-shader-pipeline/glfw/src/input.c"
                  ,0x48f,"int glfwGetGamepadState(int, GLFWgamepadstate *)");
  }
  state->axes[0] = 0.0;
  state->axes[1] = 0.0;
  state->axes[2] = 0.0;
  state->axes[3] = 0.0;
  state->buttons[0] = '\0';
  state->buttons[1] = '\0';
  state->buttons[2] = '\0';
  state->buttons[3] = '\0';
  state->buttons[4] = '\0';
  state->buttons[5] = '\0';
  state->buttons[6] = '\0';
  state->buttons[7] = '\0';
  *(undefined8 *)(state->buttons + 8) = 0;
  state->axes[4] = 0.0;
  state->axes[5] = 0.0;
  if (_glfw.initialized == 0) {
    iVar7 = 0;
    _glfwInputError(0x10001,(char *)0x0);
  }
  else {
    iVar7 = 0;
    if (((_glfw.joysticks[(uint)jid].present != 0) &&
        (iVar4 = _glfwPlatformPollJoystick(_glfw.joysticks + (uint)jid,3), iVar7 = 0, iVar4 != 0))
       && (_glfw.joysticks[(uint)jid].mapping != (_GLFWmapping *)0x0)) {
      lVar5 = 0;
      do {
        p_Var3 = _glfw.joysticks[(uint)jid].mapping;
        uVar1 = p_Var3->buttons[lVar5].type;
        if (uVar1 == '\x03') {
          bVar2 = p_Var3->buttons[lVar5].value;
          uVar6 = '\x01';
          if ((_glfw.joysticks[(uint)jid].hats[bVar2 >> 4] & bVar2 & 0xf) != 0) goto LAB_00133d0a;
        }
        else {
          if (uVar1 == '\x02') {
            uVar6 = _glfw.joysticks[(uint)jid].buttons[p_Var3->buttons[lVar5].value];
          }
          else if ((uVar1 != '\x01') ||
                  (uVar6 = '\x01',
                  ABS(_glfw.joysticks[(uint)jid].axes[p_Var3->buttons[lVar5].value]) <= 0.5))
          goto LAB_00133d0d;
LAB_00133d0a:
          state->buttons[lVar5] = uVar6;
        }
LAB_00133d0d:
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0xf);
      p_Var3 = _glfw.joysticks[(uint)jid].mapping;
      lVar5 = 0;
      do {
        if (p_Var3->axes[lVar5].type == '\x01') {
          fVar8 = _glfw.joysticks[(uint)jid].axes[p_Var3->axes[lVar5].value];
LAB_00133d8c:
          state->axes[lVar5] = fVar8;
        }
        else {
          uVar1 = p_Var3->buttons[lVar5].type;
          if (uVar1 == '\x02') {
            fVar8 = (float)_glfw.joysticks[(uint)jid].buttons[p_Var3->axes[lVar5].value];
            goto LAB_00133d8c;
          }
          if ((uVar1 == '\x03') &&
             (bVar2 = p_Var3->axes[lVar5].value, fVar8 = 1.0,
             (_glfw.joysticks[(uint)jid].hats[bVar2 >> 4] & bVar2 & 0xf) != 0)) goto LAB_00133d8c;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      iVar7 = 1;
    }
  }
  return iVar7;
}

Assistant:

GLFWAPI int glfwGetGamepadState(int jid, GLFWgamepadstate* state)
{
    int i;
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);
    assert(state != NULL);

    memset(state, 0, sizeof(GLFWgamepadstate));

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    js = _glfw.joysticks + jid;
    if (!js->present)
        return GLFW_FALSE;

    if (!_glfwPlatformPollJoystick(js, _GLFW_POLL_ALL))
        return GLFW_FALSE;

    if (!js->mapping)
        return GLFW_FALSE;

    for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
    {
        if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_AXIS)
        {
            if (fabsf(js->axes[js->mapping->buttons[i].value]) > 0.5f)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = js->mapping->buttons[i].value >> 4;
            const unsigned int bit = js->mapping->buttons[i].value & 0xf;
            if (js->hats[hat] & bit)
                state->buttons[i] = GLFW_PRESS;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_BUTTON)
            state->buttons[i] = js->buttons[js->mapping->buttons[i].value];
    }

    for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
    {
        if (js->mapping->axes[i].type == _GLFW_JOYSTICK_AXIS)
            state->axes[i] = js->axes[js->mapping->axes[i].value];
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_HATBIT)
        {
            const unsigned int hat = js->mapping->axes[i].value >> 4;
            const unsigned int bit = js->mapping->axes[i].value & 0xf;
            if (js->hats[hat] & bit)
                state->axes[i] = 1.f;
        }
        else if (js->mapping->buttons[i].type == _GLFW_JOYSTICK_BUTTON)
            state->axes[i] = (float) js->buttons[js->mapping->axes[i].value];
    }

    return GLFW_TRUE;
}